

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O3

int unz64local_getLong(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,uLong *pX)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  uLong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int i;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
  iVar2 = -1;
  if (iVar1 == 0) {
    uVar5 = (ulong)uStack_38._4_4_;
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
    if (iVar1 == 0) {
      lVar6 = (long)uStack_38._4_4_;
      iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
      if (iVar1 == 0) {
        lVar4 = (long)uStack_38._4_4_;
        iVar2 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
        uVar3 = 0;
        if (iVar2 == 0) {
          uVar3 = (long)uStack_38._4_4_ * 0x1000000 + (lVar6 << 8 | uVar5 | lVar4 << 0x10);
        }
        goto LAB_001a9da2;
      }
    }
  }
  uVar3 = 0;
LAB_001a9da2:
  *pX = uVar3;
  return iVar2;
}

Assistant:

local int unz64local_getLong(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    uLong* pX)
{
    uLong x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (uLong)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 8;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 16;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x += ((uLong)i) << 24;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}